

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_reader.cpp
# Opt level: O2

data_ptr_t __thiscall duckdb::MetadataReader::BasePtr(MetadataReader *this)

{
  idx_t iVar1;
  data_ptr_t pdVar2;
  idx_t iVar3;
  
  pdVar2 = BufferHandle::Ptr(&(this->block).handle);
  iVar1 = this->index;
  iVar3 = MetadataManager::GetMetadataBlockSize(this->manager);
  return pdVar2 + iVar3 * iVar1;
}

Assistant:

data_ptr_t MetadataReader::BasePtr() {
	return block.handle.Ptr() + index * GetMetadataManager().GetMetadataBlockSize();
}